

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkInterfaceRuntimeLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  mapped_type *this_01;
  bool local_81;
  undefined1 local_68 [8];
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> implicitTargets;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string *lang;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmOptionalLinkInterface *iface_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  this_00 = &(iface->super_cmLinkInterface).Languages;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  lang = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&lang);
    if (!bVar1) {
      return;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar1 = std::operator==(local_40,"CUDA");
    if (bVar1) {
LAB_005aac3a:
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>_>
           ::find(&(iface->super_cmLinkInterface).LanguageRuntimeLibraries,local_40);
      implicitTargets.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>_>
                    ::end(&(iface->super_cmLinkInterface).LanguageRuntimeLibraries);
      local_81 = std::__detail::operator==
                           (&local_48,
                            (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
                             *)&implicitTargets.
                                super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
    }
    else {
      bVar1 = std::operator==(local_40,"HIP");
      local_81 = false;
      if (bVar1) goto LAB_005aac3a;
    }
    if (local_81 != false) {
      anon_unknown.dwarf_baaa9c::computeImplicitLanguageTargets<cmLinkItem>
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_68,local_40,config,this);
      this_01 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>_>
                ::operator[](&(iface->super_cmLinkInterface).LanguageRuntimeLibraries,local_40);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (this_01,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_68);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_68);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterfaceRuntimeLibraries(
  const std::string& config, cmOptionalLinkInterface& iface) const
{
  for (std::string const& lang : iface.Languages) {
    if ((lang == "CUDA" || lang == "HIP") &&
        iface.LanguageRuntimeLibraries.find(lang) ==
          iface.LanguageRuntimeLibraries.end()) {
      auto implicitTargets =
        computeImplicitLanguageTargets<cmLinkItem>(lang, config, this);
      iface.LanguageRuntimeLibraries[lang] = std::move(implicitTargets);
    }
  }
}